

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<10,_6,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Matrix<float,_3,_2> *extraout_RDX;
  Matrix<float,_3,_2> *extraout_RDX_00;
  Matrix<float,_3,_2> *mat;
  Type in0;
  Mat2x3 local_6c;
  MatrixCaseUtils local_54 [12];
  VecAccess<float,_4,_3> local_48;
  Matrix<float,_3,_2> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,6>(&local_6c,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
    mat = extraout_RDX;
  }
  else {
    tcu::Matrix<float,_3,_2>::Matrix(&local_6c,(float *)s_constInMat2x3);
    mat = extraout_RDX_00;
  }
  negate<float,3,2>(&local_30,(MatrixCaseUtils *)&local_6c,mat);
  reduceToVec3(local_54,&local_30);
  local_48.m_vector = &evalCtx->color;
  local_48.m_index[0] = 0;
  local_48.m_index[1] = 1;
  local_48.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_48,(Vector<float,_3> *)local_54);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}